

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)3>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridLocalPolynomial *this
          ,double tolerance,TypeRefinement criteria,int output,
          vector<int,_std::allocator<int>_> *level_limits,double *scale_correction)

{
  uint uVar1;
  size_t sVar2;
  BaseCanonicalGrid *pBVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  int iVar5;
  pointer pDVar6;
  SimpleConstructData *pSVar7;
  _Fwd_list_node_base _Var8;
  GridLocalPolynomial *pGVar9;
  int *piVar10;
  long lVar11;
  pointer pDVar12;
  int *p_1;
  _Fwd_list_impl _Var13;
  pointer piVar14;
  anon_class_16_2_32987795 apply;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> weighted_points;
  vector<int,_std::allocator<int>_> p;
  vector<int,_std::allocator<int>_> initial_levels;
  MultiIndexSet new_points;
  vector<double,_std::allocator<double>_> refine_weights;
  vector<double,_std::allocator<double>_> norm;
  anon_class_32_4_cc64a04a getDominantSurplus;
  MultiIndexSet refine_candidates;
  allocator_type local_189;
  GridLocalPolynomial *local_188;
  _Fwd_list_impl local_180;
  _Fwd_list_node_base local_178;
  long local_170;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  undefined1 local_130 [16];
  pointer local_120;
  pointer local_118;
  pointer local_110;
  int local_104;
  MultiIndexSet local_100;
  _Fwd_list_node_base *local_d8;
  pointer local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  _Fwd_list_node_base *local_b0;
  long local_a8;
  _Fwd_list_node_base *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  vector<double,_std::allocator<double>_> local_90;
  GridLocalPolynomial *local_78;
  long *local_70;
  int *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  MultiIndexSet local_58;
  
  local_104 = output;
  getRefinementCanidates<(TasGrid::RuleLocal::erule)3>
            (&local_58,this,tolerance,criteria,output,level_limits,scale_correction);
  pSVar7 = (this->dynamic_values)._M_t.
           super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
           .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
  if ((pSVar7->initial_points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == *(pointer *)((long)&(pSVar7->initial_points).indexes + 8))
  {
    local_100.cache_num_indexes = local_58.cache_num_indexes;
    local_100.num_dimensions = local_58.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::vector(&local_100.indexes,&local_58.indexes);
  }
  else {
    MultiIndexSet::operator-(&local_100,&local_58,&pSVar7->initial_points);
  }
  getNormalization(&local_90,this);
  iVar5 = 1;
  if (local_104 == -1) {
    iVar5 = (this->super_BaseCanonicalGrid).num_outputs;
  }
  local_118 = (pointer)CONCAT44(local_118._4_4_,criteria);
  lVar11 = (long)iVar5;
  local_d8 = (_Fwd_list_node_base *)0x0;
  local_b0 = (_Fwd_list_node_base *)0x0;
  local_a0 = (_Fwd_list_node_base *)scale_correction;
  if (scale_correction == (double *)0x0) {
    local_78 = (GridLocalPolynomial *)0x3ff0000000000000;
    local_a8 = lVar11;
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_168,(this->super_BaseCanonicalGrid).points.cache_num_indexes * lVar11,
               (value_type_conflict2 *)&local_78,(allocator_type *)&local_c8);
    local_a0 = (_Fwd_list_node_base *)
               local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_d8 = (_Fwd_list_node_base *)
               local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_b0 = (_Fwd_list_node_base *)
               local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  local_70 = &local_a8;
  local_68 = &local_104;
  local_188 = this;
  local_a8 = lVar11;
  local_98 = __return_storage_ptr__;
  local_78 = this;
  local_60 = &local_90;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,(long)local_100.cache_num_indexes,(allocator_type *)&local_168);
  if (0 < local_100.cache_num_indexes) {
    pBVar3 = &local_188->super_BaseCanonicalGrid;
    lVar11 = 0;
    do {
      local_130._0_8_ = (pointer)0x0;
      ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,std::allocator<int>> *)&local_168,
                 local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + local_100.num_dimensions * lVar11,
                 local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + local_100.num_dimensions * lVar11 +
                 local_100.num_dimensions,(allocator_type *)&local_180);
      apply.getDominantSurplus = (anon_class_32_4_cc64a04a *)level_limits;
      apply.weight = (double *)&local_78;
      HierarchyManipulations::
      touchAllImmediateRelatives<(TasGrid::RuleLocal::erule)3,TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)3>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(int)_2_>
                ((HierarchyManipulations *)&local_168,
                 (vector<int,_std::allocator<int>_> *)&pBVar3->points,(MultiIndexSet *)local_130,
                 apply);
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = (double)local_130._0_8_;
      if ((_Fwd_list_node_base *)
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (_Fwd_list_node_base *)0x0) {
        operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < local_100.cache_num_indexes);
  }
  if (((uint)local_118 & 0xfffffffd) == 1 &&
      local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>
              ((vector<int,_std::allocator<int>_> *)&local_168,&local_100);
    pGVar9 = local_188;
    HierarchyManipulations::splitByLevels<int>
              ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)local_130,
               local_100.num_dimensions,
               (const_iterator)
               local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (const_iterator)
               local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (const_iterator)
               local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_130._8_8_ != local_130._0_8_) {
      pDVar6 = (pointer)local_130._0_8_;
      pDVar12 = (pointer)local_130._8_8_;
      do {
        if (0 < (int)pDVar12[-1].num_strips) {
          lVar11 = 0;
          do {
            piVar10 = pDVar12[-1].vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + pDVar12[-1].stride * lVar11;
            ::std::vector<int,std::allocator<int>>::vector<int*,void>
                      ((vector<int,std::allocator<int>> *)&local_180,piVar10,
                       piVar10 + (pGVar9->super_BaseCanonicalGrid).num_dimensions,
                       (allocator_type *)&local_110);
            iVar5 = MultiIndexSet::getSlot(&local_100,(int *)local_180._M_head._M_next);
            _Var8._M_next = local_178._M_next;
            if (local_180._M_head._M_next != (_Fwd_list_node_base)local_178._M_next) {
              local_118 = (pointer)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar5];
              _Var13._M_head._M_next = local_180._M_head._M_next;
              do {
                uVar1 = *(uint *)&((_Fwd_list_node_base *)_Var13._M_head._M_next)->_M_next;
                if (uVar1 == 0) {
                  *(int *)&((_Fwd_list_node_base *)_Var13._M_head._M_next)->_M_next = -1;
                }
                else {
                  *(int *)&((_Fwd_list_node_base *)_Var13._M_head._M_next)->_M_next =
                       (int)((uVar1 - ((int)(uVar1 - 1) >> 0x1f)) + -1) >> 1;
                  if ((uVar1 < 0xfffffffe) &&
                     (iVar5 = MultiIndexSet::getSlot(&local_100,(int *)local_180._M_head._M_next),
                     iVar5 != -1)) {
                    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5] =
                         local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar5] + (double)local_118;
                  }
                }
                *(uint *)&((_Fwd_list_node_base *)_Var13._M_head._M_next)->_M_next = uVar1;
                _Var13._M_head._M_next =
                     (_Fwd_list_node_base)
                     ((long)&((_Fwd_list_node_base *)_Var13._M_head._M_next)->_M_next + 4);
                pGVar9 = local_188;
              } while (_Var13._M_head._M_next != (_Fwd_list_node_base)_Var8._M_next);
            }
            if (local_180._M_head._M_next != (_Fwd_list_node_base *)0x0) {
              operator_delete((void *)local_180._M_head._M_next,
                              local_170 - (long)local_180._M_head._M_next);
            }
            lVar11 = lVar11 + 1;
            pDVar6 = (pointer)local_130._0_8_;
          } while (lVar11 < (int)pDVar12[-1].num_strips);
        }
        pDVar12 = pDVar12 + -1;
      } while (pDVar12 != pDVar6);
    }
    ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::~vector
              ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)local_130);
    if ((_Fwd_list_node_base *)
        local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (_Fwd_list_node_base *)0x0) {
      operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    pGVar9 = local_188;
    if ((uint)local_118 == 4 &&
        local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>
                ((vector<int,_std::allocator<int>_> *)&local_168,&local_100);
      HierarchyManipulations::splitByLevels<int>
                ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)local_130,
                 local_100.num_dimensions,
                 (const_iterator)
                 local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (const_iterator)
                 local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (const_iterator)
                 local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_130._8_8_ != local_130._0_8_) {
        local_d0 = (pointer)0x0;
        pDVar6 = (pointer)local_130._0_8_;
        pDVar12 = (pointer)local_130._8_8_;
        do {
          piVar14 = local_d0;
          if (0 < (int)pDVar12[-1].num_strips) {
            lVar11 = 0;
            do {
              piVar10 = pDVar12[-1].vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + pDVar12[-1].stride * lVar11;
              local_118 = piVar14;
              ::std::vector<int,std::allocator<int>>::vector<int*,void>
                        ((vector<int,std::allocator<int>> *)&local_180,piVar10,
                         piVar10 + (local_188->super_BaseCanonicalGrid).num_dimensions,
                         (allocator_type *)&local_110);
              iVar5 = MultiIndexSet::getSlot(&local_100,(int *)local_180._M_head._M_next);
              if (local_180._M_head._M_next != (_Fwd_list_node_base *)0x0) {
                operator_delete((void *)local_180._M_head._M_next,
                                local_170 - (long)local_180._M_head._M_next);
              }
              piVar14 = (pointer)(local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar5] + (double)local_d0
                                 );
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar5] = (double)piVar14;
              if ((double)piVar14 <= (double)local_118) {
                piVar14 = local_118;
              }
              lVar11 = lVar11 + 1;
              pDVar6 = (pointer)local_130._0_8_;
            } while (lVar11 < (int)pDVar12[-1].num_strips);
          }
          local_d0 = piVar14;
          pDVar12 = pDVar12 + -1;
        } while (pDVar12 != pDVar6);
      }
      ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::~vector
                ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)local_130);
      pGVar9 = local_188;
      if ((_Fwd_list_node_base *)
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (_Fwd_list_node_base *)0x0) {
        operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        pGVar9 = local_188;
      }
    }
  }
  HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>
            ((vector<int,_std::allocator<int>_> *)local_130,
             &((pGVar9->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
              initial_points);
  local_180._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  pSVar7 = (pGVar9->dynamic_values)._M_t.
           super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
           .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
  if (0 < (pSVar7->initial_points).cache_num_indexes) {
    lVar11 = 0;
    do {
      sVar2 = (pSVar7->initial_points).num_dimensions;
      piVar10 = (int *)(sVar2 * lVar11 * 4 +
                       *(long *)&(pSVar7->initial_points).indexes.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data);
      ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,std::allocator<int>> *)&local_168,piVar10,piVar10 + sVar2,
                 (allocator_type *)&local_110);
      local_110 = (pointer)(-1.0 / (double)*(int *)((long)(size_t *)local_130._0_8_ + lVar11 * 4));
      __l._M_len = 1;
      __l._M_array = (iterator)&local_110;
      ::std::vector<double,_std::allocator<double>_>::vector(&local_150,__l,&local_189);
      _Var8._M_next = (_Fwd_list_node_base *)operator_new(0x38);
      _Var8._M_next[1]._M_next =
           (_Fwd_list_node_base *)
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var8._M_next[2]._M_next =
           (_Fwd_list_node_base *)
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      _Var8._M_next[3]._M_next =
           (_Fwd_list_node_base *)
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      _Var8._M_next[4]._M_next =
           (_Fwd_list_node_base *)
           local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var8._M_next[5]._M_next =
           (_Fwd_list_node_base *)
           local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      _Var8._M_next[6]._M_next =
           (_Fwd_list_node_base *)
           local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (_Var8._M_next)->_M_next = (_Fwd_list_node_base *)local_180._M_head._M_next;
      pSVar7 = (local_188->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
      lVar11 = lVar11 + 1;
      local_180._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var8._M_next;
    } while (lVar11 < (pSVar7->initial_points).cache_num_indexes);
  }
  if (0 < local_100.cache_num_indexes) {
    lVar11 = 0;
    do {
      ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,std::allocator<int>> *)&local_168,
                 local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + local_100.num_dimensions * lVar11,
                 local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + local_100.num_dimensions * lVar11 +
                 local_100.num_dimensions,(allocator_type *)&local_110);
      local_110 = (pointer)(1.0 / local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar11]);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_110;
      ::std::vector<double,_std::allocator<double>_>::vector(&local_150,__l_00,&local_189);
      _Var8._M_next = (_Fwd_list_node_base *)operator_new(0x38);
      _Var8._M_next[1]._M_next =
           (_Fwd_list_node_base *)
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var8._M_next[2]._M_next =
           (_Fwd_list_node_base *)
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      _Var8._M_next[3]._M_next =
           (_Fwd_list_node_base *)
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      _Var8._M_next[4]._M_next =
           (_Fwd_list_node_base *)
           local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var8._M_next[5]._M_next =
           (_Fwd_list_node_base *)
           local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      _Var8._M_next[6]._M_next =
           (_Fwd_list_node_base *)
           local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (_Var8._M_next)->_M_next = (_Fwd_list_node_base *)local_180._M_head._M_next;
      lVar11 = lVar11 + 1;
      local_180._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var8._M_next;
    } while (lVar11 < local_100.cache_num_indexes);
  }
  ::std::forward_list<TasGrid::NodeData,std::allocator<TasGrid::NodeData>>::
  sort<TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)3>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(TasGrid::NodeData_const&,TasGrid::NodeData_const&)_1_>
            ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)&local_180);
  pvVar4 = local_98;
  listToLocalNodes<TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)3>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(int)_3_>
            (local_98,(TasGrid *)&local_180,
             (long)(local_188->super_BaseCanonicalGrid).num_dimensions);
  ::std::_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::~_Fwd_list_base
            ((_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)&local_180);
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0 != (_Fwd_list_node_base *)0x0) {
    operator_delete(local_b0,(long)local_d8 - (long)local_b0);
  }
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pvVar4;
}

Assistant:

std::vector<double> GridLocalPolynomial::getCandidateConstructionPoints(double tolerance, TypeRefinement criteria, int output,
                                                                        std::vector<int> const &level_limits, double const *scale_correction){
    // combine the initial points with negative weights and the refinement candidates with surplus weights (no need to normalize, the sort uses relative values)
    MultiIndexSet refine_candidates = getRefinementCanidates<effrule>(tolerance, criteria, output, level_limits, scale_correction);
    MultiIndexSet new_points = (dynamic_values->initial_points.empty()) ? std::move(refine_candidates) : refine_candidates - dynamic_values->initial_points;

    // compute the weights for the new_points points
    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){ // if no scale provided, assume default 1.0
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, points.getNumIndexes()), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    auto getDominantSurplus = [&](int i)-> double{
        double dominant = 0.0;
        const double *s = surpluses.getStrip(i);
        const double *c = scale.getStrip(i);
        if (output == -1){
            for(int k=0; k<num_outputs; k++) dominant = std::max(dominant, c[k] * std::abs(s[k]) / norm[k]);
        }else{
            dominant = c[0] * std::abs(s[output]) / norm[output];
        }
        return dominant;
    };

    std::vector<double> refine_weights(new_points.getNumIndexes());

    #pragma omp parallel for
    for(int i=0; i<new_points.getNumIndexes(); i++){
        double weight = 0.0;
        std::vector<int> p = new_points.copyIndex(i);

        HierarchyManipulations::touchAllImmediateRelatives<effrule>(p, points,
                [&](int relative)->void{ weight = std::max(weight, getDominantSurplus(relative)); });
        refine_weights[i] = weight; // those will be inverted
    }

    // if using stable refinement, ensure the weight of the parents is never less than the children
    if (!new_points.empty() && ((criteria == refine_parents_first) || (criteria == refine_fds))){
        auto rlevels = HierarchyManipulations::computeLevels<effrule>(new_points);
        auto split = HierarchyManipulations::splitByLevels(new_points, rlevels);
        for(auto is = split.rbegin(); is != split.rend(); is++){
            for(int i=0; i<is->getNumStrips(); i++){
                std::vector<int> parent(is->getStrip(i), is->getStrip(i) + num_dimensions);
                double correction = refine_weights[new_points.getSlot(parent)]; // will never be missing
                for(auto &p : parent){
                    int r = p;
                    p = RuleLocal::getParent<effrule>(r);
                    int ip = (p == -1) ? -1 : new_points.getSlot(parent); // if parent is among the refined
                    if (ip != -1) refine_weights[ip] += correction;
                    p = RuleLocal::getStepParent<effrule>(r);
                    ip = (p == -1) ? -1 : new_points.getSlot(parent); // if parent is among the refined
                    if (ip != -1) refine_weights[ip] += correction;
                    p = r;
                }
            }
        }
    }else if (!new_points.empty() && (criteria == refine_stable)){
        // stable refinement, ensure that if level[i] < level[j] then weight[i] > weight[j]
        auto rlevels = HierarchyManipulations::computeLevels<effrule>(new_points);
        auto split = HierarchyManipulations::splitByLevels(new_points, rlevels);
        double max_weight = 0.0;
        for(auto is = split.rbegin(); is != split.rend(); is++){ // loop backwards in levels
            double correction = max_weight;
            for(int i=0; i<is->getNumStrips(); i++){
                int idx = new_points.getSlot(std::vector<int>(is->getStrip(i), is->getStrip(i) + num_dimensions));
                refine_weights[idx] += correction;
                max_weight = std::max(max_weight, refine_weights[idx]);
            }
        }
    }

    // compute the weights for the initial points
    std::vector<int> initial_levels = HierarchyManipulations::computeLevels<effrule>(dynamic_values->initial_points);

    std::forward_list<NodeData> weighted_points;
    for(int i=0; i<dynamic_values->initial_points.getNumIndexes(); i++)
        weighted_points.push_front({dynamic_values->initial_points.copyIndex(i), {-1.0 / ((double) initial_levels[i])}});
    for(int i=0; i<new_points.getNumIndexes(); i++)
        weighted_points.push_front({new_points.copyIndex(i), {1.0 / refine_weights[i]}});

    // sort and return the sorted list
    weighted_points.sort([&](const NodeData &a, const NodeData &b)->bool{ return (a.value[0] < b.value[0]); });

    return listToLocalNodes(weighted_points, num_dimensions, [&](int i)->double{ return RuleLocal::getNode<effrule>(i); });
}